

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O1

void __thiscall
choc::value::Value::addMember<choc::value::Value>(Value *this,string_view name,Value *v)

{
  Content *pCVar1;
  ComplexArray *other;
  undefined8 __ptr;
  Allocator *pAVar2;
  Object *pOVar3;
  Object *this_00;
  Type local_88;
  Value *local_68;
  ValueView local_60;
  
  local_88.mainType = (v->value).type.mainType;
  pCVar1 = &(v->value).type.content;
  local_88.content.object = (Object *)0x0;
  local_88.allocator = (Allocator *)0x0;
  local_68 = this;
  if (local_88.mainType == object) {
    pOVar3 = pCVar1->object;
    this_00 = (Object *)malloc(0x28);
    Type::Object::Object(this_00,(Allocator *)0x0,pOVar3);
    local_88.content.object = this_00;
  }
  else if (local_88.mainType == complexArray) {
    other = pCVar1->complexArray;
    pOVar3 = (Object *)malloc(0x18);
    Type::ComplexArray::ComplexArray((ComplexArray *)pOVar3,(Allocator *)0x0,other);
    local_88.content._0_8_ = pOVar3;
  }
  else {
    local_88.content._8_8_ = *(undefined8 *)((long)&(v->value).type.content + 8);
    local_88.content.object = pCVar1->object;
  }
  Type::addObjectMember(&(this->value).type,name,&local_88);
  pAVar2 = local_88.allocator;
  __ptr = local_88.content.complexArray;
  if ((char)local_88.mainType < '\0') {
    if (local_88.mainType == object) {
      if (local_88.content.object == (Object *)0x0) goto LAB_001e0403;
      Type::Object::~Object(local_88.content.object);
    }
    else {
      if ((local_88.mainType != complexArray) || (local_88.content.object == (Object *)0x0))
      goto LAB_001e0403;
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_88.content.object);
    }
    if (pAVar2 == (Allocator *)0x0) {
      free((void *)__ptr);
    }
    else {
      (**(code **)(*(long *)pAVar2 + 0x20))(pAVar2,__ptr);
    }
  }
LAB_001e0403:
  ValueView::ValueView(&local_60,&v->value);
  appendValue(local_68,&local_60);
  if ((char)local_60.type.mainType < '\0') {
    if (local_60.type.mainType == object) {
      if (local_60.type.content.object == (Object *)0x0) {
        return;
      }
      Type::Object::~Object(local_60.type.content.object);
    }
    else {
      if (local_60.type.mainType != complexArray) {
        return;
      }
      if (local_60.type.content.object == (Object *)0x0) {
        return;
      }
      Type::AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup>::~AllocatedVector
                ((AllocatedVector<choc::value::Type::ComplexArray::RepeatedGroup> *)
                 local_60.type.content.object);
    }
    if (local_60.type.allocator == (Allocator *)0x0) {
      free(local_60.type.content.object);
    }
    else {
      (**(code **)(*(long *)local_60.type.allocator + 0x20))
                (local_60.type.allocator,local_60.type.content.object);
    }
  }
  return;
}

Assistant:

void Value::addMember (std::string_view name, MemberType v, Others&&... others)
{
    static_assert ((sizeof...(others) & 1) == 0, "The arguments must be a sequence of name, value pairs");

    static_assert (isPrimitiveType<MemberType>() || isStringType<MemberType>() || isValueType<MemberType>(),
                   "The template type needs to be one of the supported primitive types");

    if constexpr (isValueType<MemberType>())
    {
        value.type.addObjectMember (name, v.getType());
        appendValue (v);
    }
    else if constexpr (isStringType<MemberType>())
    {
        auto stringHandle = dictionary.getHandleForString (v);
        appendMember (name, Type::createString(), std::addressof (stringHandle.handle), sizeof (stringHandle.handle));
    }
    else if constexpr (matchesType<MemberType, int32_t>())   { appendMember (name, Type::createInt32(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, int64_t>())   { appendMember (name, Type::createInt64(),   std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, float>())     { appendMember (name, Type::createFloat32(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, double>())    { appendMember (name, Type::createFloat64(), std::addressof (v), sizeof (v)); }
    else if constexpr (matchesType<MemberType, bool>())      { uint8_t b = v ? 1 : 0; appendMember (name, Type::createBool(), std::addressof (b), sizeof (b)); }

    if constexpr (sizeof...(others) != 0)
        addMember (std::forward<Others> (others)...);
}